

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

void __thiscall wasm::MergeBlocks::visitThrow(MergeBlocks *this,Throw *curr)

{
  PassRunner *pPVar1;
  Module *module;
  Block *outer;
  bool bVar2;
  Expression **ppEVar3;
  uint uVar4;
  ulong index;
  EffectAnalyzer local_1a8;
  Block *local_48;
  MergeBlocks *local_40;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_38;
  
  local_38 = &(curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  uVar4 = 0;
  local_48 = (Block *)0x0;
  local_40 = this;
  while( true ) {
    index = (ulong)uVar4;
    if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements <= index) {
      return;
    }
    pPVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
             ).super_Pass.runner;
    module = (this->
             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
             ).
             super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
             .
             super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
             .currModule;
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (local_38,index);
    EffectAnalyzer::EffectAnalyzer(&local_1a8,&pPVar1->options,module,*ppEVar3);
    bVar2 = EffectAnalyzer::hasSideEffects(&local_1a8);
    EffectAnalyzer::~EffectAnalyzer(&local_1a8);
    this = local_40;
    outer = local_48;
    if (bVar2) break;
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (local_38,index);
    local_48 = optimize(this,(Expression *)curr,ppEVar3,outer,(Expression **)0x0,(Expression **)0x0)
    ;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    Block* outer = nullptr;
    for (Index i = 0; i < curr->operands.size(); i++) {
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr->operands[i])
            .hasSideEffects()) {
        return;
      }
      outer = optimize(curr, curr->operands[i], outer);
    }
  }